

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O0

bool __thiscall picojson::default_parse_context::set_number(default_parse_context *this,double f)

{
  value local_28;
  double local_18;
  double f_local;
  default_parse_context *this_local;
  
  local_18 = f;
  f_local = (double)this;
  value::value(&local_28,f);
  value::operator=(this->out_,&local_28);
  value::~value(&local_28);
  return true;
}

Assistant:

bool set_number(double f) {
    *out_ = value(f);
    return true;
  }